

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O2

int Cudd_EnableReorderingReporting(DdManager *dd)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Cudd_AddHook(dd,Cudd_StdPreReordHook,CUDD_PRE_REORDERING_HOOK);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    iVar1 = Cudd_AddHook(dd,Cudd_StdPostReordHook,CUDD_POST_REORDERING_HOOK);
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

int
Cudd_EnableReorderingReporting(
  DdManager *dd)
{
    if (!Cudd_AddHook(dd, Cudd_StdPreReordHook, CUDD_PRE_REORDERING_HOOK)) {
        return(0);
    }
    if (!Cudd_AddHook(dd, Cudd_StdPostReordHook, CUDD_POST_REORDERING_HOOK)) {
        return(0);
    }
    return(1);

}